

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateSource
          (MessageGenerator *this,Printer *printer)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  FieldDescriptor *pFVar6;
  FieldGenerator *pFVar7;
  FieldDescriptor **ppFVar8;
  iterator iVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  char *pcVar12;
  MessageOptions *this_00;
  size_type sVar13;
  reference ppOVar14;
  size_t sVar15;
  ulong uVar16;
  reference ppEVar17;
  Descriptor *pDVar18;
  long lVar19;
  reference ppOVar20;
  reference ppEVar21;
  reference ppMVar22;
  int i_00;
  int i_01;
  Descriptor *descriptor;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_508;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_500;
  iterator iter_5;
  __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
  local_4f0;
  iterator iter_4;
  __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
  local_4e0;
  iterator iter_3;
  undefined1 local_4d0 [4];
  int i_6;
  undefined1 local_4b0 [8];
  string suffix_added;
  string parent_class_name;
  string local_450;
  int local_42c;
  undefined1 local_428 [4];
  int i_5;
  string local_408;
  string local_3e8;
  int local_3c4;
  undefined1 local_3c0 [4];
  int i_4;
  string text_format_data_str;
  string local_380;
  __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
  local_360;
  __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
  local_358;
  iterator iter_2;
  key_type local_348;
  string local_328;
  allocator<char> local_301;
  value_type local_300;
  allocator<char> local_2d9;
  value_type local_2d8;
  undefined1 local_2b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  init_flags;
  key_type local_298;
  allocator<char> local_271;
  key_type local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  allocator<char> local_209;
  key_type local_208;
  allocator<char> local_1e1;
  key_type local_1e0;
  allocator<char> local_1b9;
  key_type local_1b8;
  undefined1 local_198 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_148;
  FieldGenerator *local_128;
  FieldGenerator *field_generator;
  undefined1 local_118 [4];
  int i_3;
  string field_description_type;
  undefined1 local_f0 [6];
  bool need_defaults;
  bool has_fields;
  TextFormatDecodeData text_format_decode_data;
  undefined1 local_d0 [4];
  int i_2;
  __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
  local_b0;
  __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
  local_a8;
  iterator iter_1;
  size_t sizeof_has_storage;
  size_t num_has_bits;
  ExtensionRange *local_78;
  int local_6c;
  undefined1 local_68 [4];
  int i_1;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_40;
  scoped_array<const_google::protobuf::FieldDescriptor_*> size_order_fields;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  iterator iStack_28;
  int i;
  __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
  local_20;
  iterator iter;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  iter._M_current = (OneofGenerator **)printer;
  bVar2 = IsMapEntryMessage(this->descriptor_);
  if (!bVar2) {
    io::Printer::Print((Printer *)iter._M_current,"#pragma mark - $classname$\n\n","classname",
                       &this->class_name_);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      io::Printer::Print((Printer *)iter._M_current,
                         "#pragma clang diagnostic push\n#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n\n"
                        );
    }
    io::Printer::Print((Printer *)iter._M_current,"@implementation $classname$\n\n","classname",
                       &this->class_name_);
    local_20._M_current =
         (OneofGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
         ::begin(&this->oneof_generators_);
    while( true ) {
      iStack_28 = std::
                  vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                  ::end(&this->oneof_generators_);
      bVar2 = __gnu_cxx::operator!=(&local_20,&stack0xffffffffffffffd8);
      if (!bVar2) break;
      ppOVar20 = __gnu_cxx::
                 __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
                 ::operator*(&local_20);
      OneofGenerator::GeneratePropertyImplementation(*ppOVar20,(Printer *)iter._M_current);
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
      ::operator++(&local_20);
    }
    for (sorted_fields.array_._4_4_ = 0; iVar3 = Descriptor::field_count(this->descriptor_),
        sorted_fields.array_._4_4_ < iVar3;
        sorted_fields.array_._4_4_ = sorted_fields.array_._4_4_ + 1) {
      pFVar6 = Descriptor::field(this->descriptor_,sorted_fields.array_._4_4_);
      pFVar7 = FieldGeneratorMap::get(&this->field_generators_,pFVar6);
      (*pFVar7->_vptr_FieldGenerator[4])(pFVar7,iter._M_current);
    }
    ppFVar8 = anon_unknown_7::SortFieldsByNumber(this->descriptor_);
    internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array
              (&size_order_fields,ppFVar8);
    ppFVar8 = anon_unknown_7::SortFieldsByStorageSize(this->descriptor_);
    internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array
              (&local_40,ppFVar8);
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              *)local_68);
    for (local_6c = 0; iVar3 = local_6c,
        iVar4 = Descriptor::extension_range_count(this->descriptor_), iVar3 < iVar4;
        local_6c = local_6c + 1) {
      local_78 = Descriptor::extension_range(this->descriptor_,local_6c);
      std::
      vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::push_back((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   *)local_68,&local_78);
    }
    iVar9 = std::
            vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            ::begin((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     *)local_68);
    iVar10 = std::
             vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
             ::end((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                    *)local_68);
    std::
    sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>
              (iVar9._M_current,iVar10._M_current);
    iVar3 = FieldGeneratorMap::CalculateHasBits(&this->field_generators_);
    iter_1._M_current = (OneofGenerator **)((long)iVar3 + 0x1fU >> 5);
    if (iter_1._M_current == (OneofGenerator **)0x0) {
      iter_1._M_current = (OneofGenerator **)0x1;
    }
    local_a8._M_current =
         (OneofGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
         ::begin(&this->oneof_generators_);
    while( true ) {
      local_b0._M_current =
           (OneofGenerator **)
           std::
           vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
           ::end(&this->oneof_generators_);
      bVar2 = __gnu_cxx::operator!=(&local_a8,&local_b0);
      if (!bVar2) break;
      ppOVar20 = __gnu_cxx::
                 __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
                 ::operator*(&local_a8);
      OneofGenerator::SetOneofIndexBase(*ppOVar20,(int)iter_1._M_current);
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
      ::operator++(&local_a8);
    }
    FieldGeneratorMap::SetOneofIndexBase(&this->field_generators_,(int)iter_1._M_current);
    iVar3 = Descriptor::oneof_decl_count(this->descriptor_);
    iVar1 = iter;
    iter_1._M_current = iter_1._M_current + (long)iVar3;
    SimpleItoa_abi_cxx11_((string *)local_d0,(protobuf *)iter_1._M_current,(long)iVar3);
    io::Printer::Print((Printer *)iVar1._M_current,
                       "\ntypedef struct $classname$__storage_ {\n  uint32_t _has_storage_[$sizeof_has_storage$];\n"
                       ,"classname",&this->class_name_,"sizeof_has_storage",(string *)local_d0);
    std::__cxx11::string::~string((string *)local_d0);
    io::Printer::Indent((Printer *)iter._M_current);
    for (text_format_decode_data.entries_.
         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        iVar3 = text_format_decode_data.entries_.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
        iVar4 = Descriptor::field_count(this->descriptor_), iVar3 < iVar4;
        text_format_decode_data.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             text_format_decode_data.entries_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      ppFVar8 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          (&local_40,
                           (long)text_format_decode_data.entries_.
                                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pFVar7 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar8);
      (*pFVar7->_vptr_FieldGenerator[2])(pFVar7,iter._M_current);
    }
    io::Printer::Outdent((Printer *)iter._M_current);
    io::Printer::Print((Printer *)iter._M_current,"} $classname$__storage_;\n\n","classname",
                       &this->class_name_);
    io::Printer::Print((Printer *)iter._M_current,
                       "// This method is threadsafe because it is initially called\n// in +initialize for each subclass.\n+ (GPBDescriptor *)descriptor {\n  static GPBDescriptor *descriptor = nil;\n  if (!descriptor) {\n"
                      );
    TextFormatDecodeData::TextFormatDecodeData((TextFormatDecodeData *)local_f0);
    iVar3 = Descriptor::field_count(this->descriptor_);
    field_description_type.field_2._M_local_buf[0xf] = 0 < iVar3;
    field_description_type.field_2._M_local_buf[0xe] =
         FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault(&this->field_generators_);
    std::__cxx11::string::string((string *)local_118);
    if ((field_description_type.field_2._M_local_buf[0xe] & 1U) == 0) {
      std::__cxx11::string::operator=((string *)local_118,"GPBMessageFieldDescription");
    }
    else {
      std::__cxx11::string::operator=((string *)local_118,"GPBMessageFieldDescriptionWithDefault");
    }
    if ((field_description_type.field_2._M_local_buf[0xf] & 1U) != 0) {
      io::Printer::Print((Printer *)iter._M_current,
                         "    static $field_description_type$ fields[] = {\n",
                         "field_description_type",(string *)local_118);
      io::Printer::Indent((Printer *)iter._M_current);
      io::Printer::Indent((Printer *)iter._M_current);
      io::Printer::Indent((Printer *)iter._M_current);
      for (field_generator._4_4_ = 0; iVar3 = field_generator._4_4_,
          iVar4 = Descriptor::field_count(this->descriptor_), iVar3 < iVar4;
          field_generator._4_4_ = field_generator._4_4_ + 1) {
        ppFVar8 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            (&size_order_fields,(long)field_generator._4_4_);
        local_128 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar8);
        FieldGenerator::GenerateFieldDescription
                  (local_128,(Printer *)iter._M_current,
                   (bool)(field_description_type.field_2._M_local_buf[0xe] & 1));
        bVar2 = FieldGenerator::needs_textformat_name_support(local_128);
        if (bVar2) {
          ppFVar8 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                              (&size_order_fields,(long)field_generator._4_4_);
          iVar3 = FieldDescriptor::number(*ppFVar8);
          FieldGenerator::generated_objc_name_abi_cxx11_(&local_148,local_128);
          FieldGenerator::raw_field_name_abi_cxx11_
                    ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,local_128);
          TextFormatDecodeData::AddString
                    ((TextFormatDecodeData *)local_f0,iVar3,&local_148,
                     (string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__cxx11::string::~string
                    ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__cxx11::string::~string((string *)&local_148);
        }
      }
      io::Printer::Outdent((Printer *)iter._M_current);
      io::Printer::Outdent((Printer *)iter._M_current);
      io::Printer::Outdent((Printer *)iter._M_current);
      io::Printer::Print((Printer *)iter._M_current,"    };\n");
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_198);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"classname",&local_1b9);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_198,&local_1b8);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&this->class_name_);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"rootclassname",&local_1e1);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_198,&local_1e0);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)this);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    pcVar12 = "NULL";
    if ((field_description_type.field_2._M_local_buf[0xf] & 1U) != 0) {
      pcVar12 = "fields";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"fields",&local_209);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_198,&local_208);
    std::__cxx11::string::operator=((string *)pmVar11,pcVar12);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    if ((field_description_type.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"fields_count",
                 (allocator<char> *)
                 ((long)&init_flags.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_198,&local_298);
      std::__cxx11::string::operator=((string *)pmVar11,"0");
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&init_flags.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    else {
      std::operator+(&local_250,"(uint32_t)(sizeof(fields) / sizeof(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118)
      ;
      std::operator+(&local_230,&local_250,"))");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"fields_count",&local_271);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_198,&local_270);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2b8);
    if ((field_description_type.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,"GPBDescriptorInitializationFlag_FieldsWithDefault",&local_2d9
                );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2b8,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
    }
    this_00 = Descriptor::options(this->descriptor_);
    bVar2 = MessageOptions::message_set_wire_format(this_00);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"GPBDescriptorInitializationFlag_WireFormat",&local_301);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2b8,&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator(&local_301);
    }
    BuildFlagsString(&local_328,FLAGTYPE_DESCRIPTOR_INITIALIZATION,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"init_flags",(allocator<char> *)((long)&iter_2._M_current + 7));
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_198,&local_348);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator((allocator<char> *)((long)&iter_2._M_current + 7));
    std::__cxx11::string::~string((string *)&local_328);
    io::Printer::Print((Printer *)iter._M_current,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_198,
                       "    GPBDescriptor *localDescriptor =\n        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n                                     rootClass:[$rootclassname$ class]\n                                          file:$rootclassname$_FileDescriptor()\n                                        fields:$fields$\n                                    fieldCount:$fields_count$\n                                   storageSize:sizeof($classname$__storage_)\n                                         flags:$init_flags$];\n"
                      );
    sVar13 = std::
             vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
             ::size(&this->oneof_generators_);
    if (sVar13 != 0) {
      io::Printer::Print((Printer *)iter._M_current,"    static const char *oneofs[] = {\n");
      local_358._M_current =
           (OneofGenerator **)
           std::
           vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
           ::begin(&this->oneof_generators_);
      while( true ) {
        local_360._M_current =
             (OneofGenerator **)
             std::
             vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
             ::end(&this->oneof_generators_);
        bVar2 = __gnu_cxx::operator!=(&local_358,&local_360);
        iVar1 = iter;
        if (!bVar2) break;
        ppOVar20 = __gnu_cxx::
                   __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
                   ::operator*(&local_358);
        OneofGenerator::DescriptorName_abi_cxx11_(&local_380,*ppOVar20);
        io::Printer::Print((Printer *)iVar1._M_current,"      \"$name$\",\n","name",&local_380);
        std::__cxx11::string::~string((string *)&local_380);
        __gnu_cxx::
        __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
        ::operator++(&local_358);
      }
      ppOVar14 = std::
                 vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                 ::operator[](&this->oneof_generators_,0);
      OneofGenerator::HasIndexAsString_abi_cxx11_
                ((string *)((long)&text_format_data_str.field_2 + 8),*ppOVar14);
      io::Printer::Print((Printer *)iVar1._M_current,
                         "    };\n    [localDescriptor setupOneofs:oneofs\n                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n                   firstHasIndex:$first_has_index$];\n"
                         ,"first_has_index",(string *)((long)&text_format_data_str.field_2 + 8));
      std::__cxx11::string::~string((string *)(text_format_data_str.field_2._M_local_buf + 8));
    }
    sVar15 = TextFormatDecodeData::num_entries((TextFormatDecodeData *)local_f0);
    if (sVar15 != 0) {
      TextFormatDecodeData::Data_abi_cxx11_((string *)local_3c0,(TextFormatDecodeData *)local_f0);
      io::Printer::Print((Printer *)iter._M_current,
                         "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n    static const char *extraTextFormatInfo ="
                        );
      for (local_3c4 = 0; uVar5 = (ulong)local_3c4, uVar16 = std::__cxx11::string::size(),
          iVar1 = iter, uVar5 < uVar16; local_3c4 = local_3c4 + 0x28) {
        std::__cxx11::string::substr((ulong)local_428,(ulong)local_3c0);
        CEscape(&local_408,(string *)local_428);
        EscapeTrigraphs(&local_3e8,&local_408);
        io::Printer::Print((Printer *)iVar1._M_current,"\n        \"$data$\"","data",&local_3e8);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)local_428);
      }
      io::Printer::Print((Printer *)iter._M_current,
                         ";\n    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
                        );
      std::__cxx11::string::~string((string *)local_3c0);
    }
    sVar13 = std::
             vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
             ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     *)local_68);
    if (sVar13 != 0) {
      io::Printer::Print((Printer *)iter._M_current,
                         "    static const GPBExtensionRange ranges[] = {\n");
      for (local_42c = 0; uVar5 = (ulong)local_42c,
          sVar13 = std::
                   vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                           *)local_68), iVar1 = iter, uVar5 < sVar13; local_42c = local_42c + 1) {
        ppEVar17 = std::
                   vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                 *)local_68,(long)local_42c);
        SimpleItoa_abi_cxx11_(&local_450,(protobuf *)(ulong)(uint)(*ppEVar17)->start,i_00);
        ppEVar17 = std::
                   vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                 *)local_68,(long)local_42c);
        SimpleItoa_abi_cxx11_
                  ((string *)((long)&parent_class_name.field_2 + 8),
                   (protobuf *)(ulong)(uint)(*ppEVar17)->end,i_01);
        io::Printer::Print((Printer *)iVar1._M_current,"      { .start = $start$, .end = $end$ },\n"
                           ,"start",&local_450,"end",
                           (string *)((long)&parent_class_name.field_2 + 8));
        std::__cxx11::string::~string((string *)(parent_class_name.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_450);
      }
      io::Printer::Print((Printer *)iter._M_current,
                         "    };\n    [localDescriptor setupExtensionRanges:ranges\n                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n"
                        );
    }
    pDVar18 = Descriptor::containing_type(this->descriptor_);
    if (pDVar18 != (Descriptor *)0x0) {
      pDVar18 = Descriptor::containing_type(this->descriptor_);
      ClassName_abi_cxx11_
                ((string *)((long)&suffix_added.field_2 + 8),(objectivec *)pDVar18,descriptor);
      io::Printer::Print((Printer *)iter._M_current,
                         "    [localDescriptor setupContainingMessageClassName:GPBStringifySymbol($parent_name$)];\n"
                         ,"parent_name",(string *)((long)&suffix_added.field_2 + 8));
      std::__cxx11::string::~string((string *)(suffix_added.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::string((string *)local_4b0);
    ClassName((string *)local_4d0,this->descriptor_,(string *)local_4b0);
    std::__cxx11::string::~string((string *)local_4d0);
    lVar19 = std::__cxx11::string::size();
    if (lVar19 != 0) {
      io::Printer::Print((Printer *)iter._M_current,
                         "    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
                         "suffix",(string *)local_4b0);
    }
    io::Printer::Print((Printer *)iter._M_current,
                       "    NSAssert(descriptor == nil, @\"Startup recursed!\");\n    descriptor = localDescriptor;\n  }\n  return descriptor;\n}\n\n@end\n\n"
                      );
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      io::Printer::Print((Printer *)iter._M_current,"#pragma clang diagnostic pop\n\n");
    }
    for (iter_3._M_current._4_4_ = 0; iVar3 = iter_3._M_current._4_4_,
        iVar4 = Descriptor::field_count(this->descriptor_), iVar3 < iVar4;
        iter_3._M_current._4_4_ = iter_3._M_current._4_4_ + 1) {
      pFVar6 = Descriptor::field(this->descriptor_,iter_3._M_current._4_4_);
      pFVar7 = FieldGeneratorMap::get(&this->field_generators_,pFVar6);
      (*pFVar7->_vptr_FieldGenerator[6])(pFVar7,iter._M_current);
    }
    local_4e0._M_current =
         (OneofGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
         ::begin(&this->oneof_generators_);
    while( true ) {
      iter_4._M_current =
           (EnumGenerator **)
           std::
           vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
           ::end(&this->oneof_generators_);
      bVar2 = __gnu_cxx::operator!=
                        (&local_4e0,
                         (__normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
                          *)&iter_4);
      if (!bVar2) break;
      ppOVar20 = __gnu_cxx::
                 __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
                 ::operator*(&local_4e0);
      OneofGenerator::GenerateClearFunctionImplementation(*ppOVar20,(Printer *)iter._M_current);
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
      ::operator++(&local_4e0);
    }
    std::__cxx11::string::~string((string *)local_4b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_198);
    std::__cxx11::string::~string((string *)local_118);
    TextFormatDecodeData::~TextFormatDecodeData((TextFormatDecodeData *)local_f0);
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::~vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
               *)local_68);
    internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&local_40);
    internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array
              (&size_order_fields);
  }
  local_4f0._M_current =
       (EnumGenerator **)
       std::
       vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
       ::begin(&this->enum_generators_);
  while( true ) {
    iter_5._M_current =
         (MessageGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
         ::end(&this->enum_generators_);
    bVar2 = __gnu_cxx::operator!=
                      (&local_4f0,
                       (__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
                        *)&iter_5);
    if (!bVar2) break;
    ppEVar21 = __gnu_cxx::
               __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
               ::operator*(&local_4f0);
    EnumGenerator::GenerateSource(*ppEVar21,(Printer *)iter._M_current);
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
    ::operator++(&local_4f0);
  }
  local_500._M_current =
       (MessageGenerator **)
       std::
       vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
       ::begin(&this->nested_message_generators_);
  while( true ) {
    local_508._M_current =
         (MessageGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
         ::end(&this->nested_message_generators_);
    bVar2 = __gnu_cxx::operator!=(&local_500,&local_508);
    if (!bVar2) break;
    ppMVar22 = __gnu_cxx::
               __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
               ::operator*(&local_500);
    GenerateSource(*ppMVar22,(Printer *)iter._M_current);
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
    ::operator++(&local_500);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSource(io::Printer* printer) {
  if (!IsMapEntryMessage(descriptor_)) {
    printer->Print(
        "#pragma mark - $classname$\n"
        "\n",
        "classname", class_name_);

    if (!deprecated_attribute_.empty()) {
      // No warnings when compiling the impl of this deprecated class.
      printer->Print(
          "#pragma clang diagnostic push\n"
          "#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n"
          "\n");
    }

    printer->Print("@implementation $classname$\n\n",
                   "classname", class_name_);

    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->GeneratePropertyImplementation(printer);
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GeneratePropertyImplementation(printer);
    }

    scoped_array<const FieldDescriptor*> sorted_fields(
        SortFieldsByNumber(descriptor_));
    scoped_array<const FieldDescriptor*> size_order_fields(
        SortFieldsByStorageSize(descriptor_));

    vector<const Descriptor::ExtensionRange*> sorted_extensions;
    for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
      sorted_extensions.push_back(descriptor_->extension_range(i));
    }

    sort(sorted_extensions.begin(), sorted_extensions.end(),
         ExtensionRangeOrdering());

    // Assign has bits:
    // 1. FieldGeneratorMap::CalculateHasBits() loops through the fields seeing
    //    who needs has bits and assigning them.
    // 2. FieldGenerator::SetOneofIndexBase() overrides has_bit with a negative
    //    index that groups all the elements in the oneof.
    size_t num_has_bits = field_generators_.CalculateHasBits();
    size_t sizeof_has_storage = (num_has_bits + 31) / 32;
    if (sizeof_has_storage == 0) {
      // In the case where no field needs has bits, don't let the _has_storage_
      // end up as zero length (zero length arrays are sort of a grey area
      // since it has to be at the start of the struct). This also ensures a
      // field with only oneofs keeps the required negative indices they need.
      sizeof_has_storage = 1;
    }
    // Tell all the fields the oneof base.
    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->SetOneofIndexBase(sizeof_has_storage);
    }
    field_generators_.SetOneofIndexBase(sizeof_has_storage);
    // sizeof_has_storage needs enough bits for the single fields that aren't in
    // any oneof, and then one int32 for each oneof (to store the field number).
    sizeof_has_storage += descriptor_->oneof_decl_count();

    printer->Print(
        "\n"
        "typedef struct $classname$__storage_ {\n"
        "  uint32_t _has_storage_[$sizeof_has_storage$];\n",
        "classname", class_name_,
        "sizeof_has_storage", SimpleItoa(sizeof_has_storage));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(size_order_fields[i])
          .GenerateFieldStorageDeclaration(printer);
    }
    printer->Outdent();

    printer->Print("} $classname$__storage_;\n\n", "classname", class_name_);


    printer->Print(
        "// This method is threadsafe because it is initially called\n"
        "// in +initialize for each subclass.\n"
        "+ (GPBDescriptor *)descriptor {\n"
        "  static GPBDescriptor *descriptor = nil;\n"
        "  if (!descriptor) {\n");

    TextFormatDecodeData text_format_decode_data;
    bool has_fields = descriptor_->field_count() > 0;
    bool need_defaults = field_generators_.DoesAnyFieldHaveNonZeroDefault();
    string field_description_type;
    if (need_defaults) {
      field_description_type = "GPBMessageFieldDescriptionWithDefault";
    } else {
      field_description_type = "GPBMessageFieldDescription";
    }
    if (has_fields) {
      printer->Print(
          "    static $field_description_type$ fields[] = {\n",
          "field_description_type", field_description_type);
      printer->Indent();
      printer->Indent();
      printer->Indent();
      for (int i = 0; i < descriptor_->field_count(); ++i) {
        const FieldGenerator& field_generator =
            field_generators_.get(sorted_fields[i]);
        field_generator.GenerateFieldDescription(printer, need_defaults);
        if (field_generator.needs_textformat_name_support()) {
          text_format_decode_data.AddString(sorted_fields[i]->number(),
                                            field_generator.generated_objc_name(),
                                            field_generator.raw_field_name());
        }
      }
      printer->Outdent();
      printer->Outdent();
      printer->Outdent();
      printer->Print(
          "    };\n");
    }

    map<string, string> vars;
    vars["classname"] = class_name_;
    vars["rootclassname"] = root_classname_;
    vars["fields"] = has_fields ? "fields" : "NULL";
    if (has_fields) {
      vars["fields_count"] =
          "(uint32_t)(sizeof(fields) / sizeof(" + field_description_type + "))";
    } else {
      vars["fields_count"] = "0";
    }

    std::vector<string> init_flags;
    if (need_defaults) {
      init_flags.push_back("GPBDescriptorInitializationFlag_FieldsWithDefault");
    }
    if (descriptor_->options().message_set_wire_format()) {
      init_flags.push_back("GPBDescriptorInitializationFlag_WireFormat");
    }
    vars["init_flags"] = BuildFlagsString(FLAGTYPE_DESCRIPTOR_INITIALIZATION,
                                          init_flags);

    printer->Print(
        vars,
        "    GPBDescriptor *localDescriptor =\n"
        "        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n"
        "                                     rootClass:[$rootclassname$ class]\n"
        "                                          file:$rootclassname$_FileDescriptor()\n"
        "                                        fields:$fields$\n"
        "                                    fieldCount:$fields_count$\n"
        "                                   storageSize:sizeof($classname$__storage_)\n"
        "                                         flags:$init_flags$];\n");
    if (oneof_generators_.size() != 0) {
      printer->Print(
          "    static const char *oneofs[] = {\n");
      for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
           iter != oneof_generators_.end(); ++iter) {
        printer->Print(
            "      \"$name$\",\n",
            "name", (*iter)->DescriptorName());
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupOneofs:oneofs\n"
          "                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n"
          "                   firstHasIndex:$first_has_index$];\n",
          "first_has_index", oneof_generators_[0]->HasIndexAsString());
    }
    if (text_format_decode_data.num_entries() != 0) {
      const string text_format_data_str(text_format_decode_data.Data());
      printer->Print(
          "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
          "    static const char *extraTextFormatInfo =");
      static const int kBytesPerLine = 40;  // allow for escaping
      for (int i = 0; i < text_format_data_str.size(); i += kBytesPerLine) {
        printer->Print(
            "\n        \"$data$\"",
            "data", EscapeTrigraphs(
                CEscape(text_format_data_str.substr(i, kBytesPerLine))));
      }
      printer->Print(
          ";\n"
          "    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n"
          "#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n");
    }
    if (sorted_extensions.size() != 0) {
      printer->Print(
          "    static const GPBExtensionRange ranges[] = {\n");
      for (int i = 0; i < sorted_extensions.size(); i++) {
        printer->Print("      { .start = $start$, .end = $end$ },\n",
                       "start", SimpleItoa(sorted_extensions[i]->start),
                       "end", SimpleItoa(sorted_extensions[i]->end));
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupExtensionRanges:ranges\n"
          "                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n");
    }
    if (descriptor_->containing_type() != NULL) {
      string parent_class_name = ClassName(descriptor_->containing_type());
      printer->Print(
          "    [localDescriptor setupContainingMessageClassName:GPBStringifySymbol($parent_name$)];\n",
          "parent_name", parent_class_name);
    }
    string suffix_added;
    ClassName(descriptor_, &suffix_added);
    if (suffix_added.size() > 0) {
      printer->Print(
          "    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
          "suffix", suffix_added);
    }
    printer->Print(
        "    NSAssert(descriptor == nil, @\"Startup recursed!\");\n"
        "    descriptor = localDescriptor;\n"
        "  }\n"
        "  return descriptor;\n"
        "}\n\n"
        "@end\n\n");

    if (!deprecated_attribute_.empty()) {
      printer->Print(
          "#pragma clang diagnostic pop\n"
          "\n");
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateCFunctionImplementations(printer);
    }

    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->GenerateClearFunctionImplementation(printer);
    }
  }

  for (vector<EnumGenerator*>::iterator iter = enum_generators_.begin();
       iter != enum_generators_.end(); ++iter) {
    (*iter)->GenerateSource(printer);
  }

  for (vector<MessageGenerator*>::iterator iter =
           nested_message_generators_.begin();
       iter != nested_message_generators_.end(); ++iter) {
    (*iter)->GenerateSource(printer);
  }
}